

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
mocker::findUnusedVariables_abi_cxx11_
          (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,mocker *this,shared_ptr<mocker::ast::FuncDecl> *func,
          unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
          *exprType)

{
  ostream *poVar1;
  __node_base *p_Var2;
  FindUnusedVariables local_b0;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.used._M_h._M_buckets = &local_b0.used._M_h._M_single_bucket;
  local_b0.super_ConstVisitor.super_VisitorBase<true,_true>._vptr_VisitorBase =
       (VisitorBase<true,_true>)&PTR_operator___001f1ec8;
  local_b0.used._M_h._M_bucket_count = 1;
  local_b0.used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.used._M_h._M_element_count = 0;
  local_b0.used._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.used._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.used._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.all._M_h._M_buckets = &local_b0.all._M_h._M_single_bucket;
  local_b0.all._M_h._M_bucket_count = 1;
  local_b0.all._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.all._M_h._M_element_count = 0;
  local_b0.all._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.all._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.all._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.lhsAssignment = false;
  local_b0.res = __return_storage_ptr__;
  local_b0.exprType =
       (unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
        *)func;
  (**(code **)(**(long **)this + 0x18))(*(long **)this,&local_b0);
  anon_unknown_5::FindUnusedVariables::~FindUnusedVariables(&local_b0);
  std::operator<<((ostream *)&std::cerr,"\nUnused variables: ");
  p_Var2 = &(__return_storage_ptr__->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::string> findUnusedVariables(
    const std::shared_ptr<ast::FuncDecl> &func,
    const std::unordered_map<ast::NodeID, std::shared_ptr<ast::Type>>
        &exprType) {
  std::unordered_set<std::string> res;
  func->accept(FindUnusedVariables{res, exprType});
  std::cerr << "\nUnused variables: ";
  for (auto &var : res) {
    std::cerr << var << ", ";
  }
  std::cerr << std::endl;
  return res;
}